

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O1

void __thiscall Spi::flash_bulk_erase(Spi *this)

{
  undefined8 in_RAX;
  uint8_t data [1];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (this->verbose == true) {
    fwrite("bulk erase..\n",0xd,1,_stdout);
  }
  uStack_18 = CONCAT17(199,(undefined7)uStack_18);
  set_gpio(this,0,0);
  xfer_spi(this,(uint8_t *)((long)&uStack_18 + 7),1);
  set_gpio(this,1,0);
  return;
}

Assistant:

void Spi::flash_bulk_erase() {
	if (verbose)
		fprintf(stdout, "bulk erase..\n");

	uint8_t data[1] = { FC_CE };
	flash_chip_select();
	xfer_spi(data, 1);
	flash_chip_deselect();
}